

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_suba_16_pi(void)

{
  int *piVar1;
  uint uVar2;
  uint addr_in;
  uint uVar3;
  
  uVar2 = m68ki_cpu.ir;
  addr_in = m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8];
  m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8] = addr_in + 2;
  my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
  if (m68ki_cpu.pmmu_enabled != 0) {
    addr_in = pmmu_translate_addr(addr_in);
  }
  uVar3 = m68k_read_memory_16(addr_in & m68ki_cpu.address_mask);
  piVar1 = (int *)((long)m68ki_cpu.dar + (ulong)(uVar2 >> 7 & 0x1c) + 0x20);
  *piVar1 = *piVar1 - (int)(short)uVar3;
  return;
}

Assistant:

static void m68k_op_suba_16_pi(void)
{
	uint* r_dst = &AX;
	uint src = MAKE_INT_16(OPER_AY_PI_16());

	*r_dst = MASK_OUT_ABOVE_32(*r_dst - src);
}